

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.c
# Opt level: O1

void pnga_matmul(char *transa,char *transb,void *alpha,void *beta,Integer g_a,Integer ailo,
                Integer aihi,Integer ajlo,Integer ajhi,Integer g_b,Integer bilo,Integer bihi,
                Integer bjlo,Integer bjhi,Integer g_c,Integer cilo,Integer cihi,Integer cjlo,
                Integer cjhi)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar10;
  DoubleComplex *pDVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  Integer IVar15;
  Integer grp_id;
  Integer IVar16;
  Integer IVar17;
  logical lVar18;
  logical lVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  uint uVar23;
  long lVar24;
  undefined1 *puVar25;
  uint *puVar26;
  int iVar27;
  uint uVar28;
  ulong uVar29;
  undefined1 *puVar30;
  long lVar31;
  long lVar32;
  size_t sVar33;
  undefined2 *puVar34;
  int iVar35;
  Integer IVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar40;
  ulong uVar41;
  undefined1 *puVar42;
  undefined1 *puVar43;
  ulong uVar44;
  ulong uVar45;
  DoubleComplex *pDVar46;
  char *pcVar47;
  undefined1 *puVar48;
  Integer *pIVar49;
  DoubleComplex *ld_00;
  ulong *ld_01;
  short sVar50;
  SingleComplex SVar51;
  DoubleComplex *adim;
  undefined4 uVar52;
  undefined4 uVar53;
  long lVar54;
  uint uVar55;
  long lVar56;
  undefined1 *puVar57;
  long lVar58;
  byte bVar59;
  uint uVar61;
  long lVar62;
  uint uVar63;
  ulong uVar64;
  long lVar65;
  uint uVar66;
  ulong uVar67;
  ulong uVar68;
  undefined1 *adim_00;
  bool bVar69;
  bool bVar70;
  bool bVar71;
  double dVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  DoubleComplex *pDVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  int iVar104;
  int iVar105;
  int iVar112;
  undefined1 auVar106 [16];
  int iVar113;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  int iVar114;
  undefined1 auVar111 [16];
  int iVar119;
  undefined1 in_XMM8 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar123 [16];
  DoubleComplex *pDStack_10640;
  long lStack_10638;
  DoublePrecision DStack_10630;
  ulong uStack_10618;
  DoubleComplex *pDStack_10610;
  DoubleComplex *pDStack_105f8;
  Integer jdim_1;
  undefined1 *puStack_105e0;
  Integer kdim_1;
  DoubleComplex *pDStack_105d0;
  ulong uStack_105c8;
  ulong uStack_105c0;
  undefined1 *puStack_105b8;
  DoubleComplex *pDStack_105b0;
  long lStack_105a8;
  ulong uStack_105a0;
  Integer cdim;
  undefined1 *puStack_10590;
  DoubleComplex *pDStack_10588;
  SingleComplex SStack_10580;
  DoubleComplex *pDStack_10578;
  Integer IStack_10570;
  byte *pbStack_10568;
  byte *pbStack_10560;
  ulong uStack_10558;
  ulong uStack_10550;
  ulong uStack_10548;
  Integer atype;
  Integer cdim_prev;
  undefined1 *puStack_10530;
  long lStack_10528;
  undefined8 uStack_10520;
  DoubleComplex ONE;
  Integer dims [2];
  DoubleComplex *a_ar [2];
  SingleComplex ONE_CF;
  DoubleComplex *c;
  Integer idim;
  DoubleComplex *b_ar [2];
  Integer rank;
  int iStack_1045c;
  Integer kdim;
  long lStack_10440;
  long lStack_10438;
  long lStack_10430;
  Integer ctype;
  Integer bdim_next;
  Integer jdim;
  undefined8 uStack_10410;
  Integer loB [2];
  Integer hiA [2];
  Integer loA [2];
  Integer btype;
  Integer cndim;
  Integer IStack_103a0;
  Integer chi [2];
  Integer clo [2];
  Integer hiC [2];
  Integer loC [2];
  Integer hiB [2];
  char *pcStack_10348;
  Integer ctype_1;
  Integer ld [2];
  Integer hiC_1 [2];
  uint auStack_10028 [8188];
  Integer irreg;
  int aiStack_8030 [5];
  uint local_801c [56];
  undefined2 local_7f3c [16262];
  long lVar39;
  byte bVar60;
  
  IStack_10570 = ailo;
  pbStack_10568 = (byte *)transb;
  pbStack_10560 = (byte *)transa;
  IVar15 = pnga_nodeid();
  loA[0] = 0;
  loA[1] = 0;
  hiA[0] = 0;
  hiA[1] = 0;
  loB[0] = 0;
  loB[1] = 0;
  hiB[0] = 0;
  hiB[1] = 0;
  loC[0] = 0;
  loC[1] = 0;
  hiC[0] = 0;
  hiC[1] = 0;
  grp_id = pnga_get_pgroup(g_a);
  IVar16 = pnga_get_pgroup(g_b);
  IVar17 = pnga_get_pgroup(g_c);
  CYCLIC_DISTR_OPT_FLAG = '\x01';
  CONTIG_CHUNKS_OPT_FLAG = 0;
  DIRECT_ACCESS_OPT_FLAG = 0;
  bVar69 = _ga_sync_begin != 0;
  iStack_1045c = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar69) {
    pnga_pgroup_sync(grp_id);
  }
  if (IVar17 != grp_id || IVar16 != grp_id) {
    pnga_error("Arrays must be defined on same group",0);
  }
  lVar18 = pnga_is_mirrored(g_a);
  lVar19 = pnga_is_mirrored(g_b);
  if (lVar18 == lVar19) {
    lVar18 = pnga_is_mirrored(g_a);
    lVar19 = pnga_is_mirrored(g_c);
    if (lVar18 != lVar19) goto LAB_0012341c;
  }
  else {
LAB_0012341c:
    IVar16 = pnga_nnodes();
    pnga_error("Processors do not match for all arrays",IVar16);
  }
  pnga_inquire(g_a,&atype,&rank,dims);
  if (rank < 3) {
    if (rank == 1) {
      lVar24 = 1;
      IVar16 = dims[0];
      if (IStack_10570 < aihi) {
        IVar16 = 1;
        lVar24 = dims[0];
      }
    }
    else {
      lVar24 = dims[0];
      IVar16 = dims[1];
      if (rank != 2) {
        pcVar47 = "rank must be atleast 1";
        goto LAB_001234bd;
      }
    }
  }
  else {
    pcVar47 = "rank is greater than 2";
LAB_001234bd:
    pnga_error(pcVar47,rank);
    lVar24 = 0;
    IVar16 = 0;
  }
  pnga_inquire(g_b,&btype,&rank,dims);
  if (rank < 3) {
    if (rank == 1) {
      IVar17 = dims[0];
      lVar56 = 1;
      if (bilo < bihi) {
        IVar17 = 1;
        lVar56 = dims[0];
      }
    }
    else {
      IVar17 = dims[1];
      lVar56 = dims[0];
      if (rank != 2) {
        pcVar47 = "rank must be atleast 1";
        goto LAB_00123551;
      }
    }
  }
  else {
    pcVar47 = "rank is greater than 2";
LAB_00123551:
    pnga_error(pcVar47,rank);
    IVar17 = 0;
    lVar56 = 0;
  }
  pnga_inquire(g_c,&ctype,&rank,dims);
  if (rank < 3) {
    if (rank == 1) {
      IVar36 = dims[0];
      lVar37 = 1;
      if (cilo < cihi) {
        IVar36 = 1;
        lVar37 = dims[0];
      }
    }
    else {
      IVar36 = dims[1];
      lVar37 = dims[0];
      if (rank != 2) {
        pcVar47 = "rank must be atleast 1";
        goto LAB_001235e1;
      }
    }
  }
  else {
    pcVar47 = "rank is greater than 2";
LAB_001235e1:
    pnga_error(pcVar47,rank);
    IVar36 = 0;
    lVar37 = 0;
  }
  if ((CONCAT44(atype._4_4_,(int)atype) != btype) || (CONCAT44(atype._4_4_,(int)atype) != ctype)) {
    pnga_error(" types mismatch ",0);
  }
  uVar20 = CONCAT44(atype._4_4_,(int)atype) - 0x3eb;
  if ((4 < uVar20) || (uVar20 == 2)) {
    pnga_error(" type error",CONCAT44(atype._4_4_,(int)atype));
  }
  if ((*pbStack_10560 | 0x20) == 0x6e) {
    if ((IStack_10570 < 1) || (IVar16 < ajhi || (ajlo < 1 || lVar24 < aihi))) {
LAB_001236b5:
      pnga_error("  g_a indices out of range ",g_a);
    }
  }
  else if ((IStack_10570 < 1) || (lVar24 < ajhi || (ajlo < 1 || IVar16 < aihi))) goto LAB_001236b5;
  if ((*pbStack_10568 | 0x20) == 0x6e) {
    if ((bilo < 1) || (IVar17 < bjhi || (bjlo < 1 || lVar56 < bihi))) {
LAB_00123741:
      pnga_error("  g_b indices out of range ",g_b);
    }
  }
  else if ((bilo < 1) || (lVar56 < bjhi || (bjlo < 1 || IVar17 < bihi))) goto LAB_00123741;
  if ((((cilo < 1) || (cjlo < 1)) || (lVar37 < cihi)) || (IVar36 < cjhi)) {
    pnga_error("  g_c indices out of range ",g_c);
  }
  lVar24 = aihi - IStack_10570;
  uVar20 = lVar24 + 1;
  lVar56 = bjhi - bjlo;
  if (cihi - cilo != lVar24) {
    pnga_error(" a & c dims error",uVar20);
  }
  lVar37 = ajhi - ajlo;
  uVar67 = lVar56 + 1;
  if (cjhi - cjlo != lVar56) {
    pnga_error(" b & c dims error",uVar67);
  }
  uVar41 = lVar37 + 1;
  if (bihi - bilo != lVar37) {
    pnga_error(" a & b dims error",uVar41);
  }
  if (((GA[g_c + 1000].irreg == 1) || (GA[g_b + 1000].irreg == 1)) ||
     ((GA[g_a + 1000].irreg == 1 || (_gai_matmul_patch_flag == 1)))) {
    bVar69 = true;
  }
  else {
    bVar69 = false;
  }
  lStack_10528 = lVar37;
  lStack_10440 = lVar56;
  pnga_inquire(g_c,&ctype,&rank,dims);
  bVar71 = true;
  if (dims[1] == uVar67 && dims[0] == uVar20) {
    bVar71 = bVar69;
  }
  uStack_105c8 = uVar67;
  uStack_105a0 = uVar20;
  if (bVar71) {
    iVar12 = 0;
  }
  else {
    iVar12 = GA_Cluster_nnodes();
    if (iVar12 < 2) {
      CONTIG_CHUNKS_OPT_FLAG = 1;
      iVar12 = 1;
      DIRECT_ACCESS_OPT_FLAG = 1;
    }
    else {
      iVar12 = 0;
    }
  }
  IVar16 = pnga_total_blocks(g_c);
  if (-1 < IVar16) {
    loA[0] = IStack_10570;
    loA[1] = ajlo;
    hiA[0] = aihi;
    hiA[1] = ajhi;
    loB[0] = bilo;
    loB[1] = bjlo;
    hiB[0] = bihi;
    hiB[1] = bjhi;
    loC[0] = cilo;
    loC[1] = cjlo;
    hiC[0] = cihi;
    hiC[1] = cjhi;
    pnga_matmul_basic((char *)pbStack_10560,(char *)pbStack_10568,alpha,beta,g_a,loA,hiA,g_b,loB,hiB
                      ,g_c,loC,hiC);
    return;
  }
  pnga_distribution(g_a,IVar15,loA,hiA);
  pnga_distribution(g_b,IVar15,loB,hiB);
  pnga_distribution(g_c,IVar15,loC,hiC);
  lVar37 = 0;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(BYTE_ARRAY_001d4589 + CONCAT44(atype._4_4_,(int)atype) * 0x10 + 0x1f);
  uVar20 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x10)) / auVar80,0);
  lVar56 = hiA[0] - loA[0];
  if (hiC[0] - loC[0] < hiA[0] - loA[0]) {
    lVar56 = hiC[0] - loC[0];
  }
  lVar65 = hiB[1] - loB[1];
  if (hiC[1] - loC[1] < hiB[1] - loB[1]) {
    lVar65 = hiC[1] - loC[1];
  }
  lVar39 = hiB[0] - loB[0];
  if (hiA[1] - loA[1] < hiB[0] - loB[0]) {
    lVar39 = hiA[1] - loA[1];
  }
  if (lVar56 < 1) {
    lVar56 = lVar37;
  }
  uVar67 = lVar56 + 1;
  if (lVar65 < 1) {
    lVar65 = lVar37;
  }
  uVar44 = lVar65 + 1;
  if (lVar39 < 1) {
    lVar39 = lVar37;
  }
  uVar38 = lVar39 + 1;
  irreg = 0;
  if (((3 < uVar67 / uVar38) || (3 < uVar38 / uVar67)) ||
     ((3 < uVar44 / uVar38 || (3 < uVar38 / uVar44)))) {
    irreg = 1;
  }
  IVar15 = pnga_type_f2c(0x3f2);
  pnga_pgroup_gop(grp_id,IVar15,&irreg,1,"max");
  bVar69 = true;
  if (irreg != 1) {
    bVar69 = bVar71;
  }
  lStack_105a8 = CONCAT44(lStack_105a8._4_4_,2 - iVar12);
  if (bVar69) {
    bVar71 = false;
    pDStack_10640 = (DoubleComplex *)0x0;
  }
  else {
    pDStack_10640 =
         gai_get_armci_memory
                   (uVar67,uVar44,uVar38,(short)(2 - iVar12),CONCAT44(atype._4_4_,(int)atype));
    bVar71 = pDStack_10640 != (DoubleComplex *)0x0;
    a_ar[0] = pDStack_10640;
  }
  IVar15 = CONCAT44(atype._4_4_,(int)atype);
  IVar16 = pnga_nnodes();
  irreg = pnga_memory_avail_type(IVar15);
  if (bVar69) {
    dVar72 = pow(((double)(long)uStack_105c8 * (double)(long)uStack_105a0 * (double)(long)uVar41) /
                 (double)(IVar16 * 10),0.3333333333333333);
    uVar64 = 0x100;
    if (0x100 < (long)dVar72) {
      uVar64 = (long)dVar72;
    }
  }
  else {
    iVar13 = (int)uVar44;
    if ((int)uVar44 < (int)uVar67) {
      iVar13 = (int)uVar67;
    }
    if (iVar13 <= (int)uVar38) {
      iVar13 = (int)uVar38;
    }
    uVar64 = (long)iVar13;
  }
  IVar16 = pnga_type_f2c(0x3f2);
  pnga_pgroup_gop(grp_id,IVar16,&irreg,1,"min");
  bVar60 = (byte)iVar12;
  bVar59 = bVar60 ^ 1;
  uVar68 = (ulong)(0x100 >> bVar59);
  uVar40 = uVar68;
  uVar45 = uVar68;
  if ((long)uVar68 < (long)uVar64) {
    if ((irreg < 0x40) && (IVar16 = pnga_pgroup_nodeid(grp_id), IVar16 == 0)) {
      pnga_error("NotEnough memory",irreg);
    }
    pDVar75 = (DoubleComplex *)
              (double)((long)((long)((double)irreg * 0.9) - (ulong)(uint)(3 << bVar59)) /
                      (long)(ulong)(uint)(3 << bVar59));
    if ((double)pDVar75 < 0.0) {
      pDStack_10578 = pDVar75;
      dVar72 = sqrt((double)pDVar75);
      pDVar75 = pDStack_10578;
    }
    else {
      dVar72 = SQRT((double)pDVar75);
    }
    if ((long)dVar72 < (long)uVar64) {
      if ((double)pDVar75 < 0.0) {
        dVar72 = sqrt((double)pDVar75);
      }
      else {
        dVar72 = SQRT((double)pDVar75);
      }
      uVar64 = (ulong)dVar72;
    }
    uVar21 = uVar44;
    uVar29 = uVar67;
    if ((!bVar69) && (bVar71)) {
      uVar38 = 0x400;
      uVar64 = 0x400;
      uVar21 = 0x400;
      uVar29 = 0x400;
    }
    uVar68 = uVar64;
    uVar40 = uVar64;
    uVar45 = uVar64;
    if (bVar69) {
      uVar68 = uStack_105a0;
      if ((long)uVar64 < (long)uStack_105a0) {
        uVar68 = uVar64;
      }
      uVar45 = uStack_105c8;
      if ((long)uVar64 < (long)uStack_105c8) {
        uVar45 = uVar64;
      }
      uVar40 = uVar41;
      if ((long)uVar64 < (long)uVar41) {
        uVar40 = uVar64;
      }
    }
    else {
      dVar72 = (double)(long)(uVar64 * uVar64);
      if (((long)uVar29 < (long)uVar64) && ((long)uVar64 < (long)uVar38)) {
        if ((long)(dVar72 / (double)(long)uVar29) <= (long)uVar38) {
          uVar38 = (long)(dVar72 / (double)(long)uVar29);
        }
        uVar45 = (ulong)(dVar72 / (double)(long)uVar38);
        uVar68 = uVar29;
      }
      else {
        if (((long)uVar29 <= (long)uVar64) || ((long)uVar64 <= (long)uVar38)) goto LAB_00123f42;
        uVar45 = (ulong)((1.0 / (double)(long)uVar38) * dVar72);
        uVar68 = uVar29;
        if ((long)uVar45 <= (long)uVar29) {
          uVar68 = uVar45;
        }
      }
      uVar40 = uVar38;
      if ((long)uVar21 < (long)uVar45) {
        uVar45 = uVar21;
      }
    }
  }
LAB_00123f42:
  if ((!bVar69) && ((CONTIG_CHUNKS_OPT_FLAG & 1) == 0)) {
    uVar41 = uVar44;
    if (((long)uVar68 <= (long)uVar67) || ((long)uVar45 <= (long)uVar44)) {
      if ((double)(long)(uVar64 * uVar64) <= (double)(long)uVar67) goto LAB_00123fb3;
      lVar56 = (long)((double)(long)(uVar64 * uVar64) / (double)(long)uVar67);
      if (lVar56 <= lVar65) {
        uVar38 = 1;
        do {
          uVar41 = uVar44 / uVar38;
          uVar38 = uVar38 + 1;
        } while (lVar56 < (long)uVar41);
      }
    }
    uVar45 = uVar41;
    uVar68 = uVar67;
    uVar40 = uVar45;
    if ((long)uVar67 < (long)uVar45) {
      uVar40 = uVar67;
    }
  }
LAB_00123fb3:
  if ((long)uVar68 < 2) {
    uVar68 = 1;
  }
  if ((long)uVar45 < 2) {
    uVar45 = 1;
  }
  uStack_10558 = 1;
  if (1 < (long)uVar40) {
    uStack_10558 = uVar40;
  }
  lVar56 = uStack_10558 << bVar59;
  uVar67 = *(ulong *)(BYTE_ARRAY_001d4589 + IVar15 * 0x10 + 0x1f);
  uStack_105c8 = uVar45;
  bVar10 = bVar71;
  if (pDStack_10640 == (DoubleComplex *)0x0) {
    pDStack_10640 =
         gai_get_armci_memory
                   (uVar68,uVar45,uStack_10558,(short)lStack_105a8,CONCAT44(atype._4_4_,(int)atype))
    ;
    a_ar[0] = pDStack_10640;
    bVar10 = true;
    if (pDStack_10640 == (DoubleComplex *)0x0) {
      bVar10 = bVar71;
    }
  }
  if (pDStack_10640 == (DoubleComplex *)0x0) {
    pDStack_10640 =
         (DoubleComplex *)
         pnga_malloc((uint)(0x30 << bVar59) / uVar67 + lVar56 * uVar68 +
                     (lVar56 + uVar68) * uStack_105c8,(int)atype,"GA mulmat bufs");
    a_ar[0] = pDStack_10640;
  }
  pDVar75 = pDStack_10640;
  if (bVar60 == 0) {
    pDVar75 = a_ar[0] + (uStack_10558 * uVar68) / uVar20 + 1;
    a_ar[1] = pDVar75;
  }
  uVar67 = (uStack_10558 * uVar68) / uVar20;
  pDStack_10610 = pDVar75 + uVar67 + 1;
  if (bVar60 == 0) {
    uVar67 = (uStack_105c8 * uStack_10558) / uVar20;
    pDVar75 = pDStack_10610 + uVar67;
    b_ar[1] = pDStack_10610 + uVar67 + 1;
  }
  else {
    pDVar75 = pDVar75 + uVar67;
  }
  uVar67 = uStack_105c8 * uStack_10558;
  lVar56 = CONCAT44(atype._4_4_,(int)atype);
  if (lVar56 == 0x3ec) {
    bVar71 = NAN(*beta);
    bVar70 = *beta == 0.0;
LAB_001241c2:
    if ((!bVar70) || (bVar71)) goto LAB_001241cb;
    bVar71 = true;
  }
  else {
    if (lVar56 != 0x3ee) {
      if (lVar56 == 0x3ef) {
        if ((*beta != 0.0) || (NAN(*beta))) goto LAB_001241cb;
        bVar71 = NAN(*(double *)((long)beta + 8));
        bVar70 = *(double *)((long)beta + 8) == 0.0;
      }
      else {
        bVar71 = NAN(*beta);
        bVar70 = *beta == 0.0;
      }
      goto LAB_001241c2;
    }
    if ((*beta == 0.0) && (!NAN(*beta))) {
      bVar71 = NAN(*(float *)((long)beta + 4));
      bVar70 = *(float *)((long)beta + 4) == 0.0;
      goto LAB_001241c2;
    }
LAB_001241cb:
    bVar71 = false;
  }
  clo[0] = cilo;
  clo[1] = cjlo;
  chi[0] = cihi;
  chi[1] = cjhi;
  b_ar[0] = pDStack_10610;
  if (!bVar71) {
    pnga_scale_patch(g_c,clo,chi,beta);
  }
  pDVar75 = pDVar75 + uVar67 / uVar20 + 2;
  uStack_105a0 = CONCAT44(atype._4_4_,(int)atype);
  if (bVar60 != 0) {
    bVar69 = false;
    cdim_prev = (Integer)pDVar75;
    IVar15 = pnga_nodeid();
    irreg = 0;
    aiStack_8030[0] = 0;
    aiStack_8030[1] = 0;
    hiC_1[0] = 0;
    hiC_1[1] = 0;
    ONE.real = 1.0;
    ONE.imag = 0.0;
    ONE_CF.real = 1.0;
    ONE_CF.imag = 0.0;
    pnga_distribution(g_c,IVar15,&irreg,hiC_1);
    IVar16 = irreg;
    IVar15 = hiC_1[0];
    uVar20 = uStack_10558;
    iVar12 = (int)hiC_1[1];
    iVar13 = (int)aiStack_8030._0_8_;
    if (DIRECT_ACCESS_OPT_FLAG == 0) {
      if ((((long)uVar68 < (long)(((int)hiC_1[0] - (int)irreg) + 1)) ||
          ((long)uStack_105c8 <
           (long)(((ulong)(uint)(iVar12 - iVar13) << 0x20) + 0x100000000) >> 0x20)) ||
         ((long)uStack_10558 < (lStack_10528 << 0x20) + 0x100000000 >> 0x20)) {
        bVar69 = false;
      }
      else {
        pnga_access_ptr(g_c,&irreg,hiC_1,&cdim_prev,ld);
        bVar69 = true;
      }
    }
    lVar24 = (long)(iVar13 + -1);
    uVar67 = (ulong)(iVar12 + -1);
    if (lVar24 <= (long)uVar67) {
      uVar44 = (ulong)(int)lStack_10528;
      puVar42 = (undefined1 *)((IVar16 << 0x20) + -0x100000000 >> 0x20);
      puVar30 = (undefined1 *)((IVar15 << 0x20) + -0x100000000 >> 0x20);
      uStack_10520 = 1 - (long)puVar42;
      lStack_105a8 = uVar68 - 1;
      SVar51.real = 0.0;
      SVar51.imag = 0.0;
      uStack_10618 = 0;
      uVar41 = uStack_105c8;
      uStack_105c0 = uVar44;
      puStack_10590 = puVar42;
      uStack_10550 = uVar67;
      do {
        lVar56 = lVar24 + uVar41;
        uVar38 = lVar24 + -1 + uVar41;
        if ((long)uVar67 < lVar56) {
          uVar38 = uVar67;
        }
        jdim = (uVar38 - lVar24) + 1;
        if (bVar71) {
          SVar51.real = 1.4013e-45;
          SVar51.imag = 0.0;
        }
        if (-1 < (long)uVar44) {
          pDStack_105b0 = (DoubleComplex *)(bjlo + uVar38);
          puStack_105b8 = (undefined1 *)(lVar24 + cjlo);
          pDStack_10588 = (DoubleComplex *)(uVar38 + cjlo);
          sVar50 = SVar51.real._0_2_;
          SVar51._1_7_ = 0;
          SVar51.real._0_1_ = sVar50 == 1;
          uStack_10548 = 0;
          do {
            uVar67 = uStack_10548 + uVar20;
            uVar20 = (uStack_10548 - 1) + uVar20;
            if ((long)uVar44 < (long)uVar67) {
              uVar20 = uVar44;
            }
            kdim = (uVar20 - uStack_10548) + 1;
            if ((long)puVar42 <= (long)puVar30) {
              puVar48 = (undefined1 *)(uStack_10548 + ajlo);
              puVar25 = (undefined1 *)(uStack_10548 + bilo);
              pDStack_10578 = (DoubleComplex *)(uVar20 + bilo);
              bVar70 = false;
              uVar41 = uStack_10520;
              SStack_10580 = SVar51;
              uStack_10548 = uVar67;
              do {
                puVar57 = puVar42 + uVar68;
                puVar43 = puVar42 + lStack_105a8;
                if ((long)puVar30 < (long)puVar57) {
                  puVar43 = puVar30;
                }
                cdim = (Integer)(puVar43 + uVar41);
                puStack_105e0 = puVar42 + IStack_10570;
                pDStack_105d0 = (DoubleComplex *)(puVar43 + IStack_10570);
                if ((*pbStack_10560 | 0x20) == 0x6e) {
                  pIVar49 = &idim;
                  adim_00 = (undefined1 *)cdim;
                  jdim_1 = (Integer)puStack_105e0;
                  puStack_105e0 = puVar48;
                  kdim_1 = (Integer)pDStack_105d0;
                  pDStack_105d0 = (DoubleComplex *)(ajlo + uVar20);
                }
                else {
                  pIVar49 = &kdim;
                  adim_00 = (undefined1 *)kdim;
                  jdim_1 = (Integer)puVar48;
                  kdim_1 = (Integer)(ajlo + uVar20);
                }
                idim = cdim;
                pnga_get(g_a,&jdim_1,&kdim_1,pDStack_10640,pIVar49);
                if (!bVar70) {
                  pIVar49 = &kdim;
                  jdim_1 = (Integer)puVar25;
                  puStack_105e0 = (undefined1 *)(lVar24 + bjlo);
                  kdim_1 = (Integer)pDStack_10578;
                  pDStack_105d0 = pDStack_105b0;
                  if ((*pbStack_10568 | 0x20) != 0x6e) {
                    pIVar49 = &jdim;
                    jdim_1 = (Integer)(lVar24 + bjlo);
                    puStack_105e0 = puVar25;
                    kdim_1 = (Integer)pDStack_105b0;
                    pDStack_105d0 = pDStack_10578;
                  }
                  uStack_10618 = *pIVar49;
                  pnga_get(g_b,&jdim_1,&kdim_1,pDStack_10610,pIVar49);
                }
                GAI_DGEMM(uStack_105a0,(char *)pbStack_10560,(char *)pbStack_10568,idim,jdim,kdim,
                          alpha,pDStack_10640,(Integer)adim_00,pDStack_10610,uStack_10618,
                          (DoubleComplex *)cdim_prev,cdim);
                if (!bVar69) {
                  jdim_1 = (Integer)(puVar42 + cilo);
                  kdim_1 = (Integer)(puVar43 + cilo);
                  if ((uStack_105a0 == 0x3ee) || (uStack_105a0 == 0x3eb)) {
                    if (((ulong)SStack_10580 & 1) != 0) goto LAB_00124752;
                    pDVar75 = (DoubleComplex *)&ONE_CF;
                  }
                  else {
                    if (((ulong)SStack_10580 & 1) != 0) {
LAB_00124752:
                      pDStack_105d0 = pDStack_10588;
                      puStack_105e0 = puStack_105b8;
                      pnga_put(g_c,&jdim_1,&kdim_1,(void *)cdim_prev,&cdim);
                      goto LAB_0012479a;
                    }
                    pDVar75 = &ONE;
                  }
                  pDStack_105d0 = pDStack_10588;
                  puStack_105e0 = puStack_105b8;
                  pnga_acc(g_c,&jdim_1,&kdim_1,(void *)cdim_prev,&cdim,pDVar75);
                }
LAB_0012479a:
                uVar41 = uVar41 - uVar68;
                bVar70 = true;
                puVar42 = puVar57;
                uVar67 = uStack_10548;
              } while ((long)puVar57 <= (long)puVar30);
            }
            uStack_10548 = uVar67;
            SVar51.real = 0.0;
            SVar51.imag = 0.0;
            uVar41 = uStack_105c8;
            puVar42 = puStack_10590;
            uVar67 = uStack_10550;
            uVar44 = uStack_105c0;
            uVar20 = uStack_10558;
          } while ((long)uStack_10548 <= (long)uStack_105c0);
        }
        lVar24 = lVar56;
      } while (lVar56 <= (long)uVar67);
    }
    goto LAB_0012623a;
  }
  if (!bVar69) {
    uStack_10550 = 0;
    pnga_nodeid();
    kdim_1 = 1;
    pDStack_105d0 = (DoubleComplex *)0x1;
    cdim_prev = 1;
    puStack_10530 = (undefined1 *)0x1;
    jdim = 0x3ff0000000000000;
    uStack_10410 = 0;
    IStack_103a0 = SUB168(ZEXT416(0x3f800000),0);
    ONE.real = (DoublePrecision)cilo;
    jdim_1 = cihi;
    ONE.imag = (DoublePrecision)cjlo;
    puStack_105e0 = (undefined1 *)cjhi;
    pnga_local_iterator_init(g_c,(_iterator_hdl *)ld);
    uStack_105c0 = 1;
    uStack_10520 = (ulong)uStack_10520._4_4_ << 0x20;
    uStack_10548 = 0;
    SStack_10580.real = 0.0;
    SStack_10580.imag = 0.0;
    uVar20 = uStack_10558;
    do {
      do {
        iVar12 = pnga_local_iterator_next
                           ((_iterator_hdl *)ld,&kdim_1,&cdim_prev,&pcStack_10348,&idim);
        if (iVar12 == 0) goto LAB_0012623a;
        pnga_inquire(g_c,&ctype_1,&cndim,&kdim);
        lVar18 = pnga_patch_intersect((Integer *)&ONE,&jdim_1,&kdim_1,&cdim_prev,cndim);
      } while (lVar18 == 0);
      iVar12 = -1;
      do {
        IVar16 = cdim_prev;
        pDVar46 = pDStack_105d0;
        IVar15 = kdim_1;
        pDStack_10588 = b_ar[0];
        c = pDVar75;
        puStack_105b8 = puStack_10530;
        bVar69 = iVar12 != -1;
        lVar24 = (cdim_prev - kdim_1) + 1;
        iVar13 = ((int)(lVar24 / (long)uVar68) + 1) - (uint)(lVar24 % (long)uVar68 == 0);
        if (0x400 < iVar13) {
          pnga_error("Increase MAX_CHUNKS value in matmul.h",0);
        }
        uVar67 = uStack_105c8;
        lStack_105a8 = IVar15 + -1;
        puVar42 = (undefined1 *)(long)iVar12;
        if (iVar12 == -1) {
          puVar42 = (undefined1 *)((long)&pDVar46[-1].imag + 7);
        }
        uVar66 = (int)IVar15 - 1;
        pDStack_10578 = (DoubleComplex *)CONCAT44(pDStack_10578._4_4_,uVar66);
        pDStack_105b0 = (DoubleComplex *)((uVar68 - 1) + IVar15);
        uVar41 = 0;
        uVar61 = 0;
        iVar27 = 0;
        do {
          puVar30 = puVar42;
          if ((long)puStack_105b8 <= (long)puVar30) break;
          puVar42 = puVar30 + uStack_105c8;
          uVar44 = (long)(int)uStack_10550;
          if (!bVar69) {
            uVar44 = uVar41;
          }
          uVar41 = uVar44;
          bVar70 = lStack_10528 < (long)uVar41;
          if ((long)uVar41 <= lStack_10528) {
            uVar53 = (undefined4)uStack_10520;
            if (!bVar69) {
              uVar53 = 1;
            }
            puVar48 = puStack_105b8;
            if ((long)puVar42 < (long)puStack_105b8) {
              puVar48 = puVar42;
            }
            iVar114 = (int)puVar30;
            if (iVar13 + iVar27 < 0x400) {
              iVar105 = (int)puVar48 + -1;
              uVar44 = uVar41 + uVar20;
              lVar24 = (uVar41 - 1) + uVar20;
              uVar38 = uVar41;
              uVar52 = uVar53;
              if (lStack_10528 < (long)uVar44) {
                lVar24 = lStack_10528;
              }
              do {
                uVar41 = uVar44;
                bVar70 = lStack_10528 < (long)uVar41;
                uVar55 = (uint)uVar38;
                if (IVar15 <= IVar16) {
                  uVar14 = (uint)lVar24;
                  uVar28 = (uVar14 - uVar55) + 1;
                  puVar26 = local_801c + (long)iVar27 * 8;
                  bVar69 = false;
                  pDVar46 = pDStack_105b0;
                  lVar24 = lStack_105a8;
                  uVar63 = uVar66;
                  iVar35 = 1 - (int)IVar15;
                  do {
                    iVar119 = (int)IVar16;
                    iVar113 = (int)pDVar46;
                    if (IVar16 < (long)pDVar46) {
                      iVar113 = iVar119;
                    }
                    lVar24 = lVar24 + uVar68;
                    if (lVar24 < IVar16) {
                      iVar119 = (int)lVar24;
                    }
                    puVar26[-3] = iVar113 + iVar35;
                    puVar26[-2] = uVar28;
                    puVar26[-7] = uVar63;
                    puVar26[-5] = iVar119 - 1;
                    puVar26[-6] = uVar55;
                    puVar26[-4] = uVar14;
                    *(short *)puVar26 = (short)uVar52;
                    if (bVar69) {
                      puVar26[-1] = puVar26[-9];
                    }
                    else {
                      lVar56 = (long)(int)uVar61;
                      auStack_10028[lVar56 * 8] = uVar28;
                      auStack_10028[lVar56 * 8 + 1] = (iVar105 - iVar114) + 1;
                      *(uint *)(hiC_1 + lVar56 * 4) = uVar55;
                      *(uint *)(hiC_1 + lVar56 * 4 + 1) = uVar14;
                      *(int *)((long)hiC_1 + lVar56 * 0x20 + 4) = iVar114;
                      *(int *)((long)hiC_1 + lVar56 * 0x20 + 0xc) = iVar105;
                      puVar26[-1] = uVar61;
                      uVar61 = uVar61 + 1;
                    }
                    iVar27 = iVar27 + 1;
                    puVar26 = puVar26 + 8;
                    uVar63 = uVar63 + (int)uVar68;
                    iVar35 = iVar35 - (int)uVar68;
                    pDVar46 = (DoubleComplex *)((long)&pDVar46->real + uVar68);
                    bVar69 = true;
                  } while (lVar24 < IVar16);
                }
                uVar20 = uStack_10558;
                if (bVar70) goto LAB_0012543f;
                lVar24 = (uVar41 - 1) + uStack_10558;
                if (lStack_10528 < (long)(uVar41 + uStack_10558)) {
                  lVar24 = lStack_10528;
                }
                uVar53 = 0;
                uVar44 = uVar41 + uStack_10558;
                uVar38 = uVar41;
                uVar52 = 0;
              } while (iVar13 + iVar27 < 0x400);
            }
            else {
              bVar70 = false;
            }
            uStack_10550 = uVar41 & 0xffffffff;
            uStack_10520 = CONCAT44(uStack_10520._4_4_,uVar53);
            iVar12 = iVar114;
LAB_0012543f:
            bVar69 = false;
            uVar41 = 0;
            puStack_10590 = puVar42;
          }
        } while (bVar70);
        if ((long)puVar30 < (long)puStack_105b8) {
          CYCLIC_DISTR_OPT_FLAG = '\x01';
        }
        if (CYCLIC_DISTR_OPT_FLAG == '\0') {
          IVar17 = pnga_get_pgroup(g_a);
          uVar20 = pnga_pgroup_nodeid(IVar17);
          iVar13 = GA[g_a + 1000].nblock[0];
          uVar41 = (ulong)(uint)((int)uVar20 >> 0x1f) << 0x20 | uVar20 & 0xffffffff;
          iVar114 = GA[g_a + 1000].nblock[1];
          uVar20 = uStack_10558;
          if (IVar15 <= IVar16) {
            lVar24 = (uVar68 - 1) + IVar15;
            lVar56 = lVar24;
            if (lVar24 < IVar16) {
              lVar56 = IVar16;
            }
            lVar56 = (lVar56 + 1) - (uVar68 + IVar15);
            uVar38 = (ulong)(lVar56 != 0);
            uVar44 = (lVar56 - uVar38) / uVar68;
            lVar56 = uVar38 + uVar44;
            auVar73._8_4_ = (int)lVar56;
            auVar73._0_8_ = lVar56;
            auVar73._12_4_ = (int)((ulong)lVar56 >> 0x20);
            uVar44 = uVar44 + uVar38 + 8 & 0xfffffffffffffff8;
            auVar73 = auVar73 ^ _DAT_001b2940;
            puVar34 = local_7f3c;
            auVar94 = _DAT_001b2030;
            auVar123 = _DAT_001b48c0;
            auVar98 = _DAT_001b48b0;
            auVar99 = _DAT_001b48a0;
            do {
              auVar80 = auVar94 ^ _DAT_001b2940;
              iVar105 = auVar73._0_4_;
              iVar104 = -(uint)(iVar105 < auVar80._0_4_);
              iVar35 = auVar73._4_4_;
              auVar81._4_4_ = -(uint)(iVar35 < auVar80._4_4_);
              iVar113 = auVar73._8_4_;
              iVar112 = -(uint)(iVar113 < auVar80._8_4_);
              iVar119 = auVar73._12_4_;
              auVar81._12_4_ = -(uint)(iVar119 < auVar80._12_4_);
              auVar90._4_4_ = iVar104;
              auVar90._0_4_ = iVar104;
              auVar90._8_4_ = iVar112;
              auVar90._12_4_ = iVar112;
              auVar115 = pshuflw(in_XMM8,auVar90,0xe8);
              auVar83._4_4_ = -(uint)(auVar80._4_4_ == iVar35);
              auVar83._12_4_ = -(uint)(auVar80._12_4_ == iVar119);
              auVar83._0_4_ = auVar83._4_4_;
              auVar83._8_4_ = auVar83._12_4_;
              auVar120 = pshuflw(in_XMM9,auVar83,0xe8);
              auVar81._0_4_ = auVar81._4_4_;
              auVar81._8_4_ = auVar81._12_4_;
              auVar80 = pshuflw(auVar115,auVar81,0xe8);
              auVar116._8_4_ = 0xffffffff;
              auVar116._0_8_ = 0xffffffffffffffff;
              auVar116._12_4_ = 0xffffffff;
              auVar116 = (auVar80 | auVar120 & auVar115) ^ auVar116;
              auVar80 = packssdw(auVar116,auVar116);
              if ((auVar80 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                puVar34[-0x70] = 0;
              }
              auVar81 = auVar83 & auVar90 | auVar81;
              auVar80 = packssdw(auVar81,auVar81);
              auVar2._8_4_ = 0xffffffff;
              auVar2._0_8_ = 0xffffffffffffffff;
              auVar2._12_4_ = 0xffffffff;
              auVar80 = packssdw(auVar80 ^ auVar2,auVar80 ^ auVar2);
              if ((auVar80._0_4_ >> 0x10 & 1) != 0) {
                puVar34[-0x60] = 0;
              }
              auVar80 = auVar123 ^ _DAT_001b2940;
              iVar104 = -(uint)(iVar105 < auVar80._0_4_);
              auVar106._4_4_ = -(uint)(iVar35 < auVar80._4_4_);
              iVar112 = -(uint)(iVar113 < auVar80._8_4_);
              auVar106._12_4_ = -(uint)(iVar119 < auVar80._12_4_);
              auVar82._4_4_ = iVar104;
              auVar82._0_4_ = iVar104;
              auVar82._8_4_ = iVar112;
              auVar82._12_4_ = iVar112;
              auVar91._4_4_ = -(uint)(auVar80._4_4_ == iVar35);
              auVar91._12_4_ = -(uint)(auVar80._12_4_ == iVar119);
              auVar91._0_4_ = auVar91._4_4_;
              auVar91._8_4_ = auVar91._12_4_;
              auVar106._0_4_ = auVar106._4_4_;
              auVar106._8_4_ = auVar106._12_4_;
              auVar80 = auVar91 & auVar82 | auVar106;
              auVar80 = packssdw(auVar80,auVar80);
              auVar3._8_4_ = 0xffffffff;
              auVar3._0_8_ = 0xffffffffffffffff;
              auVar3._12_4_ = 0xffffffff;
              auVar80 = packssdw(auVar80 ^ auVar3,auVar80 ^ auVar3);
              if ((auVar80 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar34[-0x50] = 0;
              }
              auVar116 = pshufhw(auVar82,auVar82,0x84);
              auVar81 = pshufhw(auVar91,auVar91,0x84);
              auVar83 = pshufhw(auVar116,auVar106,0x84);
              auVar84._8_4_ = 0xffffffff;
              auVar84._0_8_ = 0xffffffffffffffff;
              auVar84._12_4_ = 0xffffffff;
              auVar84 = (auVar83 | auVar81 & auVar116) ^ auVar84;
              auVar116 = packssdw(auVar84,auVar84);
              if ((auVar116 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar34[-0x40] = 0;
              }
              auVar116 = auVar98 ^ _DAT_001b2940;
              iVar104 = -(uint)(iVar105 < auVar116._0_4_);
              auVar86._4_4_ = -(uint)(iVar35 < auVar116._4_4_);
              iVar112 = -(uint)(iVar113 < auVar116._8_4_);
              auVar86._12_4_ = -(uint)(iVar119 < auVar116._12_4_);
              auVar92._4_4_ = iVar104;
              auVar92._0_4_ = iVar104;
              auVar92._8_4_ = iVar112;
              auVar92._12_4_ = iVar112;
              auVar80 = pshuflw(auVar80,auVar92,0xe8);
              auVar85._4_4_ = -(uint)(auVar116._4_4_ == iVar35);
              auVar85._12_4_ = -(uint)(auVar116._12_4_ == iVar119);
              auVar85._0_4_ = auVar85._4_4_;
              auVar85._8_4_ = auVar85._12_4_;
              in_XMM9 = pshuflw(auVar120 & auVar115,auVar85,0xe8);
              in_XMM9 = in_XMM9 & auVar80;
              auVar86._0_4_ = auVar86._4_4_;
              auVar86._8_4_ = auVar86._12_4_;
              auVar80 = pshuflw(auVar80,auVar86,0xe8);
              auVar115._8_4_ = 0xffffffff;
              auVar115._0_8_ = 0xffffffffffffffff;
              auVar115._12_4_ = 0xffffffff;
              auVar115 = (auVar80 | in_XMM9) ^ auVar115;
              auVar80 = packssdw(auVar115,auVar115);
              if ((auVar80 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                puVar34[-0x30] = 0;
              }
              auVar86 = auVar85 & auVar92 | auVar86;
              auVar80 = packssdw(auVar86,auVar86);
              auVar120._8_4_ = 0xffffffff;
              auVar120._0_8_ = 0xffffffffffffffff;
              auVar120._12_4_ = 0xffffffff;
              auVar80 = packssdw(auVar80 ^ auVar120,auVar80 ^ auVar120);
              if ((auVar80 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                puVar34[-0x20] = 0;
              }
              auVar80 = auVar99 ^ _DAT_001b2940;
              iVar105 = -(uint)(iVar105 < auVar80._0_4_);
              auVar107._4_4_ = -(uint)(iVar35 < auVar80._4_4_);
              iVar113 = -(uint)(iVar113 < auVar80._8_4_);
              auVar107._12_4_ = -(uint)(iVar119 < auVar80._12_4_);
              auVar87._4_4_ = iVar105;
              auVar87._0_4_ = iVar105;
              auVar87._8_4_ = iVar113;
              auVar87._12_4_ = iVar113;
              auVar93._4_4_ = -(uint)(auVar80._4_4_ == iVar35);
              auVar93._12_4_ = -(uint)(auVar80._12_4_ == iVar119);
              auVar93._0_4_ = auVar93._4_4_;
              auVar93._8_4_ = auVar93._12_4_;
              auVar107._0_4_ = auVar107._4_4_;
              auVar107._8_4_ = auVar107._12_4_;
              auVar80 = auVar93 & auVar87 | auVar107;
              auVar80 = packssdw(auVar80,auVar80);
              auVar4._8_4_ = 0xffffffff;
              auVar4._0_8_ = 0xffffffffffffffff;
              auVar4._12_4_ = 0xffffffff;
              in_XMM8 = packssdw(auVar80 ^ auVar4,auVar80 ^ auVar4);
              if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar34[-0x10] = 0;
              }
              auVar80 = pshufhw(auVar87,auVar87,0x84);
              auVar83 = pshufhw(auVar93,auVar93,0x84);
              auVar116 = pshufhw(auVar80,auVar107,0x84);
              auVar88._8_4_ = 0xffffffff;
              auVar88._0_8_ = 0xffffffffffffffff;
              auVar88._12_4_ = 0xffffffff;
              auVar88 = (auVar116 | auVar83 & auVar80) ^ auVar88;
              auVar80 = packssdw(auVar88,auVar88);
              if ((auVar80 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *puVar34 = 0;
              }
              lVar56 = auVar94._8_8_;
              auVar94._0_8_ = auVar94._0_8_ + 8;
              auVar94._8_8_ = lVar56 + 8;
              lVar56 = auVar123._8_8_;
              auVar123._0_8_ = auVar123._0_8_ + 8;
              auVar123._8_8_ = lVar56 + 8;
              lVar56 = auVar98._8_8_;
              auVar98._0_8_ = auVar98._0_8_ + 8;
              auVar98._8_8_ = lVar56 + 8;
              lVar56 = auVar99._8_8_;
              auVar99._0_8_ = auVar99._0_8_ + 8;
              auVar99._8_8_ = lVar56 + 8;
              puVar34 = puVar34 + 0x80;
              uVar44 = uVar44 - 8;
            } while (uVar44 != 0);
            if (IVar15 <= IVar16) {
              if (lVar24 < IVar16) {
                lVar24 = IVar16;
              }
              lVar24 = (lVar24 + 1) - (uVar68 + IVar15);
              uVar38 = (ulong)(lVar24 != 0);
              uVar44 = (lVar24 - uVar38) / uVar68;
              lVar24 = uVar38 + uVar44;
              auVar74._8_4_ = (int)lVar24;
              auVar74._0_8_ = lVar24;
              auVar74._12_4_ = (int)((ulong)lVar24 >> 0x20);
              puVar34 = local_7f3c +
                        (long)(((int)((long)uVar41 / (long)iVar13) +
                               (int)((long)uVar41 % (long)iVar13)) % iVar114) * 0x10;
              uVar41 = uVar44 + uVar38 + 8 & 0xfffffffffffffff8;
              auVar76 = _DAT_001b2030;
              auVar77 = _DAT_001b48c0;
              auVar78 = _DAT_001b48b0;
              auVar79 = _DAT_001b48a0;
              do {
                auVar80 = auVar74 ^ _DAT_001b2940;
                auVar94 = auVar76 ^ _DAT_001b2940;
                iVar13 = auVar80._0_4_;
                iVar113 = -(uint)(iVar13 < auVar94._0_4_);
                iVar114 = auVar80._4_4_;
                auVar96._4_4_ = -(uint)(iVar114 < auVar94._4_4_);
                iVar105 = auVar80._8_4_;
                iVar119 = -(uint)(iVar105 < auVar94._8_4_);
                iVar35 = auVar80._12_4_;
                auVar96._12_4_ = -(uint)(iVar35 < auVar94._12_4_);
                auVar108._4_4_ = iVar113;
                auVar108._0_4_ = iVar113;
                auVar108._8_4_ = iVar119;
                auVar108._12_4_ = iVar119;
                auVar80 = pshuflw(in_XMM9,auVar108,0xe8);
                auVar95._4_4_ = -(uint)(auVar94._4_4_ == iVar114);
                auVar95._12_4_ = -(uint)(auVar94._12_4_ == iVar35);
                auVar95._0_4_ = auVar95._4_4_;
                auVar95._8_4_ = auVar95._12_4_;
                auVar123 = pshuflw(in_XMM10,auVar95,0xe8);
                auVar96._0_4_ = auVar96._4_4_;
                auVar96._8_4_ = auVar96._12_4_;
                auVar94 = pshuflw(auVar80,auVar96,0xe8);
                auVar121._8_4_ = 0xffffffff;
                auVar121._0_8_ = 0xffffffffffffffff;
                auVar121._12_4_ = 0xffffffff;
                auVar121 = (auVar94 | auVar123 & auVar80) ^ auVar121;
                auVar94 = packssdw(auVar121,auVar121);
                if ((auVar94 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  puVar34[-0x70] = 1;
                }
                auVar96 = auVar95 & auVar108 | auVar96;
                auVar94 = packssdw(auVar96,auVar96);
                auVar5._8_4_ = 0xffffffff;
                auVar5._0_8_ = 0xffffffffffffffff;
                auVar5._12_4_ = 0xffffffff;
                auVar94 = packssdw(auVar94 ^ auVar5,auVar94 ^ auVar5);
                if ((auVar94._0_4_ >> 0x10 & 1) != 0) {
                  puVar34[-0x60] = 1;
                }
                auVar94 = auVar77 ^ _DAT_001b2940;
                iVar113 = -(uint)(iVar13 < auVar94._0_4_);
                auVar117._4_4_ = -(uint)(iVar114 < auVar94._4_4_);
                iVar119 = -(uint)(iVar105 < auVar94._8_4_);
                auVar117._12_4_ = -(uint)(iVar35 < auVar94._12_4_);
                auVar97._4_4_ = iVar113;
                auVar97._0_4_ = iVar113;
                auVar97._8_4_ = iVar119;
                auVar97._12_4_ = iVar119;
                auVar109._4_4_ = -(uint)(auVar94._4_4_ == iVar114);
                auVar109._12_4_ = -(uint)(auVar94._12_4_ == iVar35);
                auVar109._0_4_ = auVar109._4_4_;
                auVar109._8_4_ = auVar109._12_4_;
                auVar117._0_4_ = auVar117._4_4_;
                auVar117._8_4_ = auVar117._12_4_;
                auVar94 = auVar109 & auVar97 | auVar117;
                auVar94 = packssdw(auVar94,auVar94);
                auVar6._8_4_ = 0xffffffff;
                auVar6._0_8_ = 0xffffffffffffffff;
                auVar6._12_4_ = 0xffffffff;
                auVar94 = packssdw(auVar94 ^ auVar6,auVar94 ^ auVar6);
                if ((auVar94 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  puVar34[-0x50] = 1;
                }
                auVar98 = pshufhw(auVar97,auVar97,0x84);
                auVar73 = pshufhw(auVar109,auVar109,0x84);
                auVar99 = pshufhw(auVar98,auVar117,0x84);
                auVar100._8_4_ = 0xffffffff;
                auVar100._0_8_ = 0xffffffffffffffff;
                auVar100._12_4_ = 0xffffffff;
                auVar100 = (auVar99 | auVar73 & auVar98) ^ auVar100;
                auVar98 = packssdw(auVar100,auVar100);
                if ((auVar98 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  puVar34[-0x40] = 1;
                }
                auVar98 = auVar78 ^ _DAT_001b2940;
                iVar113 = -(uint)(iVar13 < auVar98._0_4_);
                auVar102._4_4_ = -(uint)(iVar114 < auVar98._4_4_);
                iVar119 = -(uint)(iVar105 < auVar98._8_4_);
                auVar102._12_4_ = -(uint)(iVar35 < auVar98._12_4_);
                auVar110._4_4_ = iVar113;
                auVar110._0_4_ = iVar113;
                auVar110._8_4_ = iVar119;
                auVar110._12_4_ = iVar119;
                auVar94 = pshuflw(auVar94,auVar110,0xe8);
                auVar101._4_4_ = -(uint)(auVar98._4_4_ == iVar114);
                auVar101._12_4_ = -(uint)(auVar98._12_4_ == iVar35);
                auVar101._0_4_ = auVar101._4_4_;
                auVar101._8_4_ = auVar101._12_4_;
                in_XMM10 = pshuflw(auVar123 & auVar80,auVar101,0xe8);
                in_XMM10 = in_XMM10 & auVar94;
                auVar102._0_4_ = auVar102._4_4_;
                auVar102._8_4_ = auVar102._12_4_;
                auVar80 = pshuflw(auVar94,auVar102,0xe8);
                auVar122._8_4_ = 0xffffffff;
                auVar122._0_8_ = 0xffffffffffffffff;
                auVar122._12_4_ = 0xffffffff;
                auVar122 = (auVar80 | in_XMM10) ^ auVar122;
                auVar80 = packssdw(auVar122,auVar122);
                if ((auVar80 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  puVar34[-0x30] = 1;
                }
                auVar102 = auVar101 & auVar110 | auVar102;
                auVar80 = packssdw(auVar102,auVar102);
                auVar7._8_4_ = 0xffffffff;
                auVar7._0_8_ = 0xffffffffffffffff;
                auVar7._12_4_ = 0xffffffff;
                auVar80 = packssdw(auVar80 ^ auVar7,auVar80 ^ auVar7);
                if ((auVar80 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  puVar34[-0x20] = 1;
                }
                auVar80 = auVar79 ^ _DAT_001b2940;
                auVar118._0_4_ = -(uint)(iVar13 < auVar80._0_4_);
                auVar118._4_4_ = -(uint)(iVar114 < auVar80._4_4_);
                auVar118._8_4_ = -(uint)(iVar105 < auVar80._8_4_);
                auVar118._12_4_ = -(uint)(iVar35 < auVar80._12_4_);
                auVar103._4_4_ = auVar118._0_4_;
                auVar103._0_4_ = auVar118._0_4_;
                auVar103._8_4_ = auVar118._8_4_;
                auVar103._12_4_ = auVar118._8_4_;
                iVar13 = -(uint)(auVar80._4_4_ == iVar114);
                iVar114 = -(uint)(auVar80._12_4_ == iVar35);
                auVar89._4_4_ = iVar13;
                auVar89._0_4_ = iVar13;
                auVar89._8_4_ = iVar114;
                auVar89._12_4_ = iVar114;
                auVar111._4_4_ = auVar118._4_4_;
                auVar111._0_4_ = auVar118._4_4_;
                auVar111._8_4_ = auVar118._12_4_;
                auVar111._12_4_ = auVar118._12_4_;
                in_XMM9 = auVar89 & auVar103 | auVar111;
                auVar80 = packssdw(auVar118,in_XMM9);
                auVar8._8_4_ = 0xffffffff;
                auVar8._0_8_ = 0xffffffffffffffff;
                auVar8._12_4_ = 0xffffffff;
                in_XMM8 = packssdw(auVar80 ^ auVar8,auVar80 ^ auVar8);
                if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  puVar34[-0x10] = 1;
                }
                auVar94 = pshufhw(auVar103,auVar103,0x84);
                auVar80 = pshufhw(auVar89,auVar89,0x84);
                auVar123 = pshufhw(auVar94,auVar111,0x84);
                auVar9._8_4_ = 0xffffffff;
                auVar9._0_8_ = 0xffffffffffffffff;
                auVar9._12_4_ = 0xffffffff;
                auVar80 = packssdw(auVar80 & auVar94,(auVar123 | auVar80 & auVar94) ^ auVar9);
                if ((auVar80 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *puVar34 = 1;
                }
                lVar24 = auVar76._8_8_;
                auVar76._0_8_ = auVar76._0_8_ + 8;
                auVar76._8_8_ = lVar24 + 8;
                lVar24 = auVar77._8_8_;
                auVar77._0_8_ = auVar77._0_8_ + 8;
                auVar77._8_8_ = lVar24 + 8;
                lVar24 = auVar78._8_8_;
                auVar78._0_8_ = auVar78._0_8_ + 8;
                auVar78._8_8_ = lVar24 + 8;
                lVar24 = auVar79._8_8_;
                auVar79._0_8_ = auVar79._0_8_ + 8;
                auVar79._8_8_ = lVar24 + 8;
                puVar34 = puVar34 + 0x80;
                uVar41 = uVar41 - 8;
              } while (uVar41 != 0);
            }
          }
        }
        bVar59 = (iVar27 == 1 && (long)puVar30 < (long)puStack_105b8) & ~DIRECT_ACCESS_OPT_FLAG;
        puStack_10590 = (undefined1 *)CONCAT71(puStack_10590._1_7_,bVar59);
        if (bVar59 == 1) {
          if ((((long)uVar68 <= cdim_prev - kdim_1) ||
              ((long)uVar67 <= (long)puStack_10530 - (long)pDStack_105d0)) ||
             ((long)uVar20 <= lStack_10528)) {
            pnga_error("Invalid task list",0);
          }
          pnga_access_ptr(g_c,&kdim_1,&cdim_prev,&c,&idim);
        }
        uVar67 = 0;
        if (CYCLIC_DISTR_OPT_FLAG == '\0') {
          IVar15 = pnga_get_pgroup(g_a);
          uVar67 = pnga_pgroup_nodeid(IVar15);
          uVar67 = (ulong)(uint)((int)uVar67 >> 0x1f) << 0x20 | uVar67 & 0xffffffff;
          uVar67 = (long)((int)((long)uVar67 / (long)GA[g_a + 1000].nblock[0]) +
                         (int)((long)uVar67 % (long)GA[g_a + 1000].nblock[0])) %
                   (long)GA[g_a + 1000].nblock[1] & 0xffffffff;
        }
        iVar13 = (int)uVar67;
        uVar41 = uStack_105c0;
        if (iVar13 < iVar27) {
          uVar66 = local_801c[(long)iVar13 * 8 + -1];
          GET_BLOCK(g_a,(task_list_t *)(&irreg + (long)iVar13 * 4),a_ar[0],(char *)pbStack_10560,
                    IStack_10570,ajlo,(Integer *)&ONE_CF,gNbhdlA);
          uStack_10548 = (long)(int)uVar66;
          GET_BLOCK(g_b,(task_list_t *)(hiC_1 + (long)(int)uVar66 * 4),pDStack_10588,
                    (char *)pbStack_10568,bilo,bjlo,&bdim_next,gNbhdlB);
          uVar41 = 1;
          uVar44 = 0;
          uVar66 = 1;
          pDStack_105b0 = (DoubleComplex *)0x0;
          uStack_105c0 = uStack_105c0 & 0xffffffff00000000;
          do {
            lVar24 = (long)(int)uVar67;
            uVar61 = local_801c[lVar24 * 8 + -1];
            iVar114 = aiStack_8030[lVar24 * 8 + 2];
            if (bVar71) {
              uStack_105c0 = CONCAT44(uStack_105c0._4_4_,(uint)(ushort)local_801c[lVar24 * 8]);
            }
            pDStack_10578 = (DoubleComplex *)((long)(int)uVar61 * 0x20);
            uVar55 = auStack_10028[(long)(int)uVar61 * 8 + 1];
            uVar63 = local_801c[lVar24 * 8 + -2];
            lStack_105a8 = bdim_next;
            uVar28 = uVar66;
            if ((CYCLIC_DISTR_OPT_FLAG == '\0') && ((int)uVar66 < iVar27)) {
              uVar28 = (int)(iVar13 + uVar66) % iVar27;
            }
            pDVar46 = a_ar[uVar44];
            cdim = (long)iVar114;
            SStack_10580 = ONE_CF;
            pnga_nbwait(gNbhdlA + uVar44);
            if (uVar41 != 0) {
              pDStack_10588 = b_ar[(ulong)pDStack_105b0 & 0xffffffff];
              pnga_nbwait(gNbhdlB + ((ulong)pDStack_105b0 & 0xffffffff));
            }
            uVar41 = uStack_10548;
            if ((int)uVar28 < iVar27) {
              uVar14 = (uint)uVar44 ^ 1;
              GET_BLOCK(g_a,(task_list_t *)(&irreg + (long)(int)uVar28 * 4),a_ar[uVar14],
                        (char *)pbStack_10560,IStack_10570,ajlo,(Integer *)&ONE_CF,gNbhdlA + uVar14)
              ;
              uVar14 = local_801c[(long)(int)uVar28 * 8 + -1];
              uVar41 = (ulong)uVar14;
              if (uVar61 != uVar14) {
                uVar23 = ~(uint)pDStack_105b0 & 1;
                pDStack_105b0 = (DoubleComplex *)(ulong)uVar23;
                uVar38 = (ulong)(uVar23 * 8);
                GET_BLOCK(g_b,(task_list_t *)(hiC_1 + (long)(int)uVar14 * 4),
                          *(void **)((long)b_ar + uVar38),(char *)pbStack_10568,bilo,bjlo,&bdim_next
                          ,(Integer *)((long)gNbhdlB + uVar38));
              }
            }
            uStack_10548 = uVar41;
            GAI_DGEMM(uStack_105a0,(char *)pbStack_10560,(char *)pbStack_10568,(long)iVar114,
                      (long)(int)uVar55,(long)(int)uVar63,alpha,pDVar46,(Integer)SStack_10580,
                      pDStack_10588,lStack_105a8,c,cdim);
            if ((int)uVar67 < iVar27 && (char)puStack_10590 == '\0') {
              ONE.real = (DoublePrecision)((int)(&irreg)[lVar24 * 4] + cilo);
              jdim_1 = aiStack_8030[lVar24 * 8] + cilo;
              ONE.imag = (DoublePrecision)
                         (*(int *)((long)&pDStack_10578->real + (long)hiC_1 + 4) + cjlo);
              puStack_105e0 =
                   (undefined1 *)(*(int *)((long)&pDStack_10578->imag + (long)hiC_1 + 4) + cjlo);
              if ((uStack_105a0 == 0x3ee) || (uStack_105a0 == 0x3eb)) {
                if ((short)uStack_105c0 == 1) goto LAB_00125fc5;
                pIVar49 = &IStack_103a0;
              }
              else {
                if ((short)uStack_105c0 == 1) {
LAB_00125fc5:
                  pnga_put(g_c,(Integer *)&ONE,&jdim_1,c,&cdim);
                  goto LAB_00126013;
                }
                pIVar49 = &jdim;
              }
              pnga_acc(g_c,(Integer *)&ONE,&jdim_1,c,&cdim,pIVar49);
            }
LAB_00126013:
            uVar41 = (ulong)(uVar61 != (uint)uVar41);
            uVar44 = (ulong)(~(uint)uVar44 & 1);
            uVar66 = uVar66 + 1;
            SStack_10580 = ONE_CF;
            uVar67 = (ulong)uVar28;
          } while ((int)uVar28 < iVar27);
        }
        uStack_105c0 = uVar41;
      } while ((long)puVar30 < (long)puStack_105b8);
    } while( true );
  }
  lStack_105a8 = pnga_nnodes();
  cdim_prev = 0;
  IVar15 = pnga_get_pgroup(g_a);
  irreg = 0x3ff0000000000000;
  aiStack_8030[0] = 0;
  aiStack_8030[1] = 0;
  idim = SUB168(ZEXT416(0x3f800000),0);
  IVar15 = pnga_pgroup_nodeid(IVar15);
  lVar56 = lStack_10528;
  hiC_1[0] = cilo;
  hiC_1[1] = cjlo;
  ld[0] = cihi;
  ld[1] = cjhi;
  if (bVar71) {
    pnga_fill_patch(g_c,hiC_1,ld,beta);
  }
  pDVar46 = (DoubleComplex *)0x0;
  if (lStack_10440 < 0) {
    uVar66 = 1;
    bVar71 = true;
    lVar24 = 0;
    lVar56 = 0;
    lVar37 = 0;
    DStack_10630 = 0.0;
    lStack_10638 = 0;
    puVar42 = (undefined1 *)0x0;
    adim = (DoubleComplex *)0x0;
    uVar20 = 0;
    bVar69 = true;
    uVar61 = 1;
  }
  else {
    uStack_10618 = 0;
    uVar66 = 0;
    bVar69 = false;
    uVar20 = 0;
    adim = (DoubleComplex *)0x0;
    puVar42 = (undefined1 *)0x0;
    lStack_10638 = 0;
    DStack_10630 = 0.0;
    uStack_10520 = 0;
    lVar65 = 0;
    pDStack_10588 = (DoubleComplex *)((ulong)pDStack_10588 & 0xffffffff00000000);
    pDStack_105b0 = (DoubleComplex *)((ulong)pDStack_105b0 & 0xffffffff00000000);
    puStack_105b8 = (undefined1 *)((ulong)puStack_105b8 & 0xffffffff00000000);
    SStack_10580 = (SingleComplex)((ulong)SStack_10580 & 0xffffffff00000000);
    lVar37 = 0;
    do {
      lVar39 = lVar37 + uStack_105c8;
      lVar54 = lVar37 + -1 + uStack_105c8;
      if (lStack_10440 < lVar39) {
        lVar54 = lStack_10440;
      }
      jdim_1 = (lVar54 - lVar37) + 1;
      if (-1 < lVar56) {
        lStack_10430 = lVar37 + bjlo;
        lStack_10438 = bjlo + lVar54;
        lVar22 = 0;
        do {
          lVar1 = lVar22 + uStack_10558;
          lVar31 = lVar22 + -1 + uStack_10558;
          if (lVar56 < lVar1) {
            lVar31 = lVar56;
          }
          kdim_1 = (lVar31 - lVar22) + 1;
          if (-1 < lVar24) {
            uStack_10550 = ajlo + lVar31;
            lVar58 = 1;
            pDStack_10640 = (DoubleComplex *)0x1;
            lVar56 = 0;
            do {
              pDVar11 = pDStack_10640;
              if (lVar65 % lStack_105a8 == IVar15) {
                lVar62 = (uVar68 - 1) + lVar56;
                if (lVar24 < (long)(uVar68 + lVar56)) {
                  lVar62 = lVar24;
                }
                pDStack_10578 = (DoubleComplex *)(lVar62 + lVar58);
                if ((*pbStack_10560 | 0x20) == 0x6e) {
                  ld_00 = &ONE;
                  hiC_1[0] = IStack_10570 + lVar56;
                  hiC_1[1] = lVar22 + ajlo;
                  ld[0] = IStack_10570 + lVar62;
                  ld[1] = uStack_10550;
                  pDStack_105f8 = pDStack_10578;
                }
                else {
                  pDStack_105f8 = (DoubleComplex *)kdim_1;
                  hiC_1[1] = IStack_10570 + lVar56;
                  ld[1] = IStack_10570 + lVar62;
                  ld_00 = (DoubleComplex *)&kdim_1;
                  hiC_1[0] = lVar22 + ajlo;
                  ld[0] = uStack_10550;
                }
                uStack_105c0 = uVar20;
                puStack_10590 = puVar42;
                uStack_10548 = (ulong)pDVar46;
                ONE.real = (DoublePrecision)pDStack_10578;
                pnga_nbget(g_a,hiC_1,ld,*(void **)((long)a_ar + (ulong)(uVar66 << 3)),
                           (Integer *)ld_00,(Integer *)((long)gNbhdlA + (ulong)(uVar66 << 3)));
                if (pDStack_10640 != (DoubleComplex *)0x0) {
                  ld_01 = (ulong *)&kdim_1;
                  hiC_1[0] = lVar22 + bilo;
                  hiC_1[1] = lStack_10430;
                  ld[0] = lVar31 + bilo;
                  ld[1] = lStack_10438;
                  if ((*pbStack_10568 | 0x20) != 0x6e) {
                    ld_01 = (ulong *)&jdim_1;
                    hiC_1[0] = lStack_10430;
                    hiC_1[1] = lVar22 + bilo;
                    ld[0] = lStack_10438;
                    ld[1] = lVar31 + bilo;
                  }
                  uStack_10520 = *ld_01;
                  pnga_nbget(g_b,hiC_1,ld,b_ar[uStack_10618],(Integer *)ld_01,gNbhdlB + uStack_10618
                            );
                }
                if (bVar69) {
                  lVar32 = (long)DStack_10630 * lStack_10638;
                  if (uStack_105a0 == 0x3eb) {
                    if (0 < lVar32) {
                      sVar33 = lVar32 * 4;
                      goto LAB_00124ccb;
                    }
                  }
                  else if ((uStack_105a0 == 0x3ec) || (uStack_105a0 == 0x3ee)) {
                    if (0 < lVar32) {
                      sVar33 = lVar32 * 8;
                      goto LAB_00124ccb;
                    }
                  }
                  else if (0 < lVar32) {
                    sVar33 = lVar32 * 0x10;
LAB_00124ccb:
                    memset(pDVar75,0,sVar33);
                  }
                  uVar20 = (ulong)((uVar66 ^ 1) << 3);
                  pDVar46 = *(DoubleComplex **)((long)a_ar + uVar20);
                  pnga_nbwait((Integer *)((long)gNbhdlA + uVar20));
                  if ((int)uStack_10548 != 0) {
                    uVar20 = (ulong)(((uint)uStack_10618 ^ 1) << 3);
                    pDStack_10610 = *(DoubleComplex **)((long)b_ar + uVar20);
                    pnga_nbwait((Integer *)((long)gNbhdlB + uVar20));
                  }
                  uVar20 = uStack_105a0;
                  GAI_DGEMM(uStack_105a0,(char *)pbStack_10560,(char *)pbStack_10568,
                            (Integer)DStack_10630,lStack_10638,(Integer)puStack_10590,alpha,pDVar46,
                            (Integer)adim,pDStack_10610,uStack_105c0,pDVar75,cdim_prev);
                  pIVar49 = &idim;
                  if ((uVar20 != 0x3eb) && (uVar20 != 0x3ee)) {
                    pIVar49 = &irreg;
                  }
                  hiC_1[0] = (int)pDStack_10588 + cilo;
                  ld[0] = (int)puStack_105b8 + cilo;
                  hiC_1[1] = (int)SStack_10580.real + cjlo;
                  ld[1] = (int)pDStack_105b0 + cjlo;
                  pnga_acc(g_c,hiC_1,ld,pDVar75,&cdim_prev,pIVar49);
                }
                DStack_10630 = ONE.real;
                lStack_10638 = jdim_1;
                cdim_prev = (Integer)pDStack_10578;
                uVar66 = uVar66 ^ 1;
                uStack_10618 = (ulong)((uint)uStack_10618 ^
                                      (uint)(pDStack_10640 != (DoubleComplex *)0x0));
                bVar69 = true;
                SStack_10580.real = (Real)lVar37;
                puStack_105b8 = (undefined1 *)CONCAT44(puStack_105b8._4_4_,(int)lVar62);
                pDStack_105b0 = (DoubleComplex *)CONCAT44(pDStack_105b0._4_4_,(int)lVar54);
                pDStack_10588 = (DoubleComplex *)CONCAT44(pDStack_10588._4_4_,(int)lVar56);
                pDStack_10640 = (DoubleComplex *)0x0;
                pDVar46 = pDVar11;
                puVar42 = (undefined1 *)kdim_1;
                uVar20 = uStack_10520;
                adim = pDStack_105f8;
              }
              lVar65 = lVar65 + 1;
              lVar56 = lVar56 + uVar68;
              lVar58 = lVar58 - uVar68;
            } while (lVar56 <= lVar24);
          }
          lVar22 = lVar1;
          lVar56 = lStack_10528;
        } while (lVar1 <= lStack_10528);
      }
      lVar37 = lVar39;
    } while (lVar39 <= lStack_10440);
    bVar69 = !bVar69;
    uVar66 = uVar66 ^ 1;
    bVar71 = (int)pDVar46 == 0;
    uVar61 = (uint)uStack_10618 ^ 1;
    lVar37 = (long)(int)pDStack_10588;
    lVar24 = (long)(int)puStack_105b8;
    pDVar46 = (DoubleComplex *)(long)(int)SStack_10580.real;
    lVar56 = (long)(int)pDStack_105b0;
  }
  if (bVar69) goto LAB_0012623a;
  lVar65 = lStack_10638 * (long)DStack_10630;
  uStack_105c0 = uVar20;
  puStack_10590 = puVar42;
  uStack_10548 = (ulong)pDVar46;
  if (uStack_105a0 == 0x3eb) {
    if (0 < lVar65) {
      sVar33 = lVar65 * 4;
      goto LAB_0012610b;
    }
  }
  else if ((uStack_105a0 == 0x3ec) || (uStack_105a0 == 0x3ee)) {
    if (0 < lVar65) {
      sVar33 = lVar65 * 8;
      goto LAB_0012610b;
    }
  }
  else if (0 < lVar65) {
    sVar33 = lVar65 * 0x10;
LAB_0012610b:
    memset(pDVar75,0,sVar33);
  }
  pDVar46 = *(DoubleComplex **)((long)a_ar + (ulong)(uVar66 << 3));
  pnga_nbwait((Integer *)((long)gNbhdlA + (ulong)(uVar66 << 3)));
  if (!bVar71) {
    pDStack_10610 = *(DoubleComplex **)((long)b_ar + (ulong)(uVar61 << 3));
    pnga_nbwait((Integer *)((long)gNbhdlB + (ulong)(uVar61 << 3)));
  }
  GAI_DGEMM(uStack_105a0,(char *)pbStack_10560,(char *)pbStack_10568,(Integer)DStack_10630,
            lStack_10638,(Integer)puStack_10590,alpha,pDVar46,(Integer)adim,pDStack_10610,
            uStack_105c0,pDVar75,cdim_prev);
  hiC_1[0] = lVar37 + cilo;
  ld[0] = lVar24 + cilo;
  hiC_1[1] = uStack_10548 + cjlo;
  ld[1] = lVar56 + cjlo;
  pIVar49 = &idim;
  if ((uStack_105a0 != 0x3eb) && (uStack_105a0 != 0x3ee)) {
    pIVar49 = &irreg;
  }
  pnga_acc(g_c,hiC_1,ld,pDVar75,&cdim_prev,pIVar49);
LAB_0012623a:
  if (bVar10) {
    ARMCI_Free_local(a_ar[0]);
  }
  else {
    pnga_free(a_ar[0]);
  }
  if (iStack_1045c != 0) {
    pnga_pgroup_sync(grp_id);
  }
  return;
}

Assistant:

void pnga_matmul(transa, transb, alpha, beta,
	       g_a, ailo, aihi, ajlo, ajhi,
	       g_b, bilo, bihi, bjlo, bjhi,
	       g_c, cilo, cihi, cjlo, cjhi)
     
     Integer g_a, ailo, aihi, ajlo, ajhi;    /* patch of g_a */
     Integer g_b, bilo, bihi, bjlo, bjhi;    /* patch of g_b */
     Integer g_c, cilo, cihi, cjlo, cjhi;    /* patch of g_c */
     void    *alpha, *beta;
     char    *transa, *transb;
{
    DoubleComplex *a=NULL, *b, *c, *a_ar[2], *b_ar[2], *c_ar[2];
    Integer adim1=0, adim2=0, bdim1=0, bdim2=0, cdim1=0, cdim2=0, dims[2];
    Integer atype, btype, ctype, rank, me= pnga_nodeid();
    Integer n, m, k, Ichunk, Kchunk, Jchunk;
    Integer loA[2]={0,0}, hiA[2]={0,0};
    Integer loB[2]={0,0}, hiB[2]={0,0};
    Integer loC[2]={0,0}, hiC[2]={0,0};
    int local_sync_begin,local_sync_end;
    short int need_scaling=SET,use_NB_matmul=SET;
    short int irregular=UNSET, use_armci_memory=UNSET;
    Integer a_grp=pnga_get_pgroup(g_a), b_grp=pnga_get_pgroup(g_b);
    Integer c_grp=pnga_get_pgroup(g_c);
    Integer numblocks;
    Integer clo[2], chi[2];

    /* OPTIMIZATIONS FLAGS. To unset an optimization, replace SET by UNSET) */
    CYCLIC_DISTR_OPT_FLAG  = UNSET;
    CONTIG_CHUNKS_OPT_FLAG = SET;
    DIRECT_ACCESS_OPT_FLAG = SET;

    local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
    _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
    if(local_sync_begin)pnga_pgroup_sync(a_grp);


    if (a_grp != b_grp || a_grp != c_grp)
       pnga_error("Arrays must be defined on same group",0L);
# if 0 /* disabled. should not fail if there are non-overlapping patches*/
    /* check if C is different from A and B */
    if (g_c == g_a || g_c == g_b)
       pnga_error("Global Array C should be different from A and B", 0);
#endif
    
    /**************************************************
     * Do All Sanity Checks 
     **************************************************/

    /* Check to make sure all global arrays are of the same type */
    if (!(pnga_is_mirrored(g_a) == pnga_is_mirrored(g_b) &&
	  pnga_is_mirrored(g_a) == pnga_is_mirrored(g_c))) {
       pnga_error("Processors do not match for all arrays",pnga_nnodes());
    }

    /* check if ranks are O.K. */
    pnga_inquire(g_a, &atype, &rank, dims); 
    VECTORCHECK(rank, dims, adim1, adim2, ailo, aihi, ajlo, ajhi);
    pnga_inquire(g_b, &btype, &rank, dims); 
    VECTORCHECK(rank, dims, bdim1, bdim2, bilo, bihi, bjlo, bjhi);
    pnga_inquire(g_c, &ctype, &rank, dims); 
    VECTORCHECK(rank, dims, cdim1, cdim2, cilo, cihi, cjlo, cjhi);

    /* check for data-types mismatch */
    if(atype != btype || atype != ctype ) pnga_error(" types mismatch ", 0L);
    if(atype != C_DCPL && atype != C_DBL && atype != C_FLOAT && atype!=C_SCPL)
       pnga_error(" type error",atype);
   
    /* check if patch indices and dims match */
    if (*transa == 'n' || *transa == 'N'){
       if (ailo <= 0 || aihi > adim1 || ajlo <= 0 || ajhi > adim2)
	  pnga_error("  g_a indices out of range ", g_a);
    }else
       if (ailo <= 0 || aihi > adim2 || ajlo <= 0 || ajhi > adim1)
	  pnga_error("  g_a indices out of range ", g_a);
   
    if (*transb == 'n' || *transb == 'N'){
       if (bilo <= 0 || bihi > bdim1 || bjlo <= 0 || bjhi > bdim2)
	  pnga_error("  g_b indices out of range ", g_b);
    }else
       if (bilo <= 0 || bihi > bdim2 || bjlo <= 0 || bjhi > bdim1)
	  pnga_error("  g_b indices out of range ", g_b);
   
    if (cilo <= 0 || cihi > cdim1 || cjlo <= 0 || cjhi > cdim2)
       pnga_error("  g_c indices out of range ", g_c);

    /* verify if patch dimensions are consistent */
    m = aihi - ailo +1;
    n = bjhi - bjlo +1;
    k = ajhi - ajlo +1;
    if( (cihi - cilo +1) != m) pnga_error(" a & c dims error",m);
    if( (cjhi - cjlo +1) != n) pnga_error(" b & c dims error",n);
    if( (bihi - bilo +1) != k) pnga_error(" a & b dims error",k);

#if DEBUG_
    if(me==0) check_result(0, transa, transb, alpha, beta, atype,
			   g_a, ailo, aihi, ajlo, ajhi,
			   g_b, bilo, bihi, bjlo, bjhi,
			   g_c, cilo, cihi, cjlo, cjhi);
    pnga_sync();
#endif

    /* switch to various matmul algorithms here. more to come */
    if( GA[GA_OFFSET + g_c].irreg == 1 ||
	GA[GA_OFFSET + g_b].irreg == 1 ||
	GA[GA_OFFSET + g_a].irreg == 1 ||
	_gai_matmul_patch_flag == SET) irregular = SET;

    /* even ga_dgemm is called, m,n & k might not match GA dimensions */
    pnga_inquire(g_c, &ctype, &rank, dims);
    if(dims[0] != m || dims[1] != n) irregular = SET; /* C matrix dims */

    if(!irregular) {
       if((adim1=GA_Cluster_nnodes()) > 1) use_NB_matmul = SET;
       else {
	  use_NB_matmul = UNSET;
	  CONTIG_CHUNKS_OPT_FLAG = UNSET;
	  DIRECT_ACCESS_OPT_FLAG = UNSET;
       }
    }

    /* if block cyclic, then use regular algorithm. This is turned on for now
     * to test block cyclic */ 
    numblocks = pnga_total_blocks(g_c);
    if(numblocks>=0) {
#if 0
       irregular     = UNSET;
       use_NB_matmul = SET; 
#else
       loA[0] = ailo;
       loA[1] = ajlo;
       hiA[0] = aihi;
       hiA[1] = ajhi;
       loB[0] = bilo;
       loB[1] = bjlo;
       hiB[0] = bihi;
       hiB[1] = bjhi;
       loC[0] = cilo;
       loC[1] = cjlo;
       hiC[0] = cihi;
       hiC[1] = cjhi;
       pnga_matmul_basic(transa, transb, alpha, beta, g_a, loA, hiA,
         g_b, loB, hiB, g_c, loC, hiC);
       return;
#endif
    }
    
    /****************************************************************
     * Get the memory (i.e.static or dynamic) for temporary buffers 
     ****************************************************************/

    /* to skip accumulate and exploit data locality:
       get chunks according to "C" matrix distribution*/
    pnga_distribution(g_a, me, loA, hiA);
    pnga_distribution(g_b, me, loB, hiB);
    pnga_distribution(g_c, me, loC, hiC);

       {
	  Integer elems, factor=sizeof(DoubleComplex)/GAsizeofM(atype);
	  short int nbuf=1;
	  DoubleComplex *tmp = NULL;

	  Ichunk = GA_MIN( (hiC[0]-loC[0]+1), (hiA[0]-loA[0]+1) );
	  Jchunk = GA_MIN( (hiC[1]-loC[1]+1), (hiB[1]-loB[1]+1) );
	  Kchunk = GA_MIN( (hiA[1]-loA[1]+1), (hiB[0]-loB[0]+1) );

#if KCHUNK_OPTIMIZATION /*works great for m=1000,n=1000,k=4000 kinda cases*/
	  pnga_distribution(g_a, me, loC, hiC);
	  Kchunk = hiC[1]-loC[1]+1;
	  pnga_distribution(g_b, me, loC, hiC);
	  Kchunk = GA_MIN(Kchunk, (hiC[0]-loC[0]+1));
#endif

	  /* Just to avoid divide by zero error */
          if(Ichunk<=0) Ichunk = 1;
          if(Jchunk<=0) Jchunk = 1;
          if(Kchunk<=0) Kchunk = 1;

	  {
	     Integer irreg=0;
	     if(Ichunk/Kchunk > GA_ASPECT_RATIO || Kchunk/Ichunk > GA_ASPECT_RATIO || 
		Jchunk/Kchunk > GA_ASPECT_RATIO || Kchunk/Jchunk > GA_ASPECT_RATIO) {
                irreg = SET;
             }
	     pnga_pgroup_gop(a_grp, pnga_type_f2c(MT_F_INT), &irreg, (Integer)1, "max");   
	     if(irreg==SET) irregular = SET;
	  }
	  
	  /* If non-blocking, we need 2 temporary buffers for A and B matrix */
	  if(use_NB_matmul) nbuf = 2; 
	  
	  if(!irregular) {
	     tmp = a_ar[0] =a=gai_get_armci_memory(Ichunk,Jchunk,Kchunk,
						   nbuf, atype);
	     if(tmp != NULL) use_armci_memory = SET;
	  }
	  
	  /* get ChunkSize (i.e.BlockSize), that fits in temporary buffer */
	  gai_get_chunk_size(irregular, &Ichunk, &Jchunk, &Kchunk, &elems, 
			     atype, m, n, k, nbuf, use_armci_memory, a_grp);
	  
	  if(tmp == NULL) { /* try once again from armci for new chunk sizes */
	     tmp = a_ar[0] =a=gai_get_armci_memory(Ichunk,Jchunk,Kchunk,
						   nbuf, atype);
	     if(tmp != NULL) use_armci_memory = SET;
	  }

	  if(tmp == NULL) { /*if armci malloc fails again, then get from MA */
	     tmp = a_ar[0] = a =(DoubleComplex*) pnga_malloc(elems,atype,
                                                      "GA mulmat bufs");
	  }

	  if(use_NB_matmul) tmp = a_ar[1] = a_ar[0] + (Ichunk*Kchunk)/factor+1;
	  
	  tmp = b_ar[0] = b = tmp + (Ichunk*Kchunk)/factor + 1;
	  if(use_NB_matmul) tmp = b_ar[1] = b_ar[0] + (Kchunk*Jchunk)/factor+1;
	  
	  c_ar[0] = c = tmp + (Kchunk*Jchunk)/factor + 1;
       }
       
       /** check if there is a need for scaling the data. 
	   Note: if beta=0, then need_scaling=0  */
       if(atype==C_DCPL){
	  if((((DoubleComplex*)beta)->real == 0) && 
	     (((DoubleComplex*)beta)->imag ==0)) need_scaling =0;} 
       else if(atype==C_SCPL){
	  if((((SingleComplex*)beta)->real == 0) && 
	     (((SingleComplex*)beta)->imag ==0)) need_scaling =0;} 
       else if(atype==C_DBL){
	  if(*(DoublePrecision *)beta == 0) need_scaling =0;}
       else if( *(float*)beta ==0) need_scaling =0;

       clo[0] = cilo; clo[1] = cjlo;
       chi[0] = cihi; chi[1] = cjhi;
       if(need_scaling) pnga_scale_patch(g_c, clo, chi, beta);

       /********************************************************************
	* Parallel Matrix Multiplication Starts Here.
	* 3 Steps:
	*    1. Get a chunk of A and B matrix, and store it in local buffer.
	*    2. Do sequential dgemm.
	*    3. Put/accumulate the result into C matrix.
	*********************************************************************/

       /* if only one node, then enable the optimized shmem code */
       if(use_NB_matmul==UNSET) { 
	  gai_matmul_shmem(transa, transb, alpha, beta, atype,
			   g_a, ailo, aihi, ajlo, ajhi,
			   g_b, bilo, bihi, bjlo, bjhi,
			   g_c, cilo, cihi, cjlo, cjhi,
			   Ichunk, Kchunk, Jchunk, a,b,c, need_scaling);
       }
       else {
	  if(irregular)
	     gai_matmul_irreg(transa, transb, alpha, beta, atype,
			      g_a, ailo, aihi, ajlo, ajhi,
			      g_b, bilo, bihi, bjlo, bjhi,
			      g_c, cilo, cihi, cjlo, cjhi,
			      Ichunk, Kchunk, Jchunk, a_ar, b_ar, c_ar,
			      need_scaling, irregular);
	  else {
	     gai_matmul_regular(transa, transb, alpha, beta, atype,
				g_a, ailo, aihi, ajlo, ajhi,
				g_b, bilo, bihi, bjlo, bjhi,
				g_c, cilo, cihi, cjlo, cjhi,
				Ichunk, Kchunk, Jchunk, a_ar, b_ar, c_ar, 
				need_scaling, irregular);
     }
       }
	     
       a = a_ar[0];
       if(use_armci_memory == SET) ARMCI_Free_local(a);
       else {
         pnga_free(a);
       }
       
#if DEBUG_
       Integer grp_me;
       grp_me = pnga_pgroup_nodeid(a_grp);
       pnga_pgroup_sync(a_grp);
       if(me==0) check_result(1, transa, transb, alpha, beta, atype,
			      g_a, ailo, aihi, ajlo, ajhi,
			      g_b, bilo, bihi, bjlo, bjhi,
			      g_c, cilo, cihi, cjlo, cjhi);
       pnga_pgroup_sync(a_grp);
#endif
       
       if(local_sync_end)pnga_pgroup_sync(a_grp);
}